

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_test.cc
# Opt level: O2

void leveldb::_Test_ConsumeDecimalNumberNoDigits::_RunIt(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  allocator aStack_31;
  string sStack_30;
  
  std::__cxx11::string::string((string *)&sStack_30,"",&aStack_31);
  ConsumeDecimalNumberNoDigitsTest(&sStack_30);
  std::__cxx11::string::~string((string *)&sStack_30);
  std::__cxx11::string::string((string *)&sStack_30," ",&aStack_31);
  ConsumeDecimalNumberNoDigitsTest(&sStack_30);
  std::__cxx11::string::~string((string *)&sStack_30);
  std::__cxx11::string::string((string *)&sStack_30,"a",&aStack_31);
  ConsumeDecimalNumberNoDigitsTest(&sStack_30);
  std::__cxx11::string::~string((string *)&sStack_30);
  std::__cxx11::string::string((string *)&sStack_30," 123",&aStack_31);
  ConsumeDecimalNumberNoDigitsTest(&sStack_30);
  std::__cxx11::string::~string((string *)&sStack_30);
  std::__cxx11::string::string((string *)&sStack_30,"a123",&aStack_31);
  ConsumeDecimalNumberNoDigitsTest(&sStack_30);
  std::__cxx11::string::~string((string *)&sStack_30);
  paVar1 = &sStack_30.field_2;
  sStack_30.field_2._M_allocated_capacity._0_4_ = 0x33323100;
  sStack_30._M_string_length = 4;
  sStack_30.field_2._M_local_buf[4] = '\0';
  sStack_30._M_dataplus._M_p = (pointer)paVar1;
  ConsumeDecimalNumberNoDigitsTest(&sStack_30);
  std::__cxx11::string::~string((string *)&sStack_30);
  sStack_30.field_2._M_allocated_capacity._0_4_ = 0x3332317f;
  sStack_30._M_string_length = 4;
  sStack_30.field_2._M_local_buf[4] = '\0';
  sStack_30._M_dataplus._M_p = (pointer)paVar1;
  ConsumeDecimalNumberNoDigitsTest(&sStack_30);
  std::__cxx11::string::~string((string *)&sStack_30);
  sStack_30.field_2._M_allocated_capacity._0_4_ = 0x333231ff;
  sStack_30._M_string_length = 4;
  sStack_30.field_2._M_local_buf[4] = '\0';
  sStack_30._M_dataplus._M_p = (pointer)paVar1;
  ConsumeDecimalNumberNoDigitsTest(&sStack_30);
  std::__cxx11::string::~string((string *)&sStack_30);
  return;
}

Assistant:

TEST(Logging, ConsumeDecimalNumberNoDigits) {
  ConsumeDecimalNumberNoDigitsTest("");
  ConsumeDecimalNumberNoDigitsTest(" ");
  ConsumeDecimalNumberNoDigitsTest("a");
  ConsumeDecimalNumberNoDigitsTest(" 123");
  ConsumeDecimalNumberNoDigitsTest("a123");
  ConsumeDecimalNumberNoDigitsTest(std::string("\000123", 4));
  ConsumeDecimalNumberNoDigitsTest(std::string("\177123", 4));
  ConsumeDecimalNumberNoDigitsTest(std::string("\377123", 4));
}